

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

Part_One_t * Part_ManMergeEntry(Part_Man_t *pMan,Part_One_t *p1,Part_One_t *p2,int nRefs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Part_One_t *pPVar4;
  int iVar5;
  ulong uVar6;
  Part_One_t *pPVar7;
  Part_One_t *pPVar8;
  
  pPVar4 = Part_ManFetchEntry(pMan,p2->nOuts + p1->nOuts,nRefs);
  pPVar8 = p1 + 1;
  pPVar7 = p2 + 1;
  iVar5 = p1->nOuts;
  iVar1 = p2->nOuts;
  uVar6 = 0;
  while ((pPVar8 < (Part_One_t *)(&p1[1].nRefs + iVar5) &&
         (pPVar7 < (Part_One_t *)(&p2[1].nRefs + iVar1)))) {
    iVar2 = pPVar8->nRefs;
    iVar3 = pPVar7->nRefs;
    if (iVar2 == iVar3) {
      pPVar8 = (Part_One_t *)&pPVar8->nOuts;
      *(int *)((long)&pPVar4[1].nRefs + uVar6) = iVar2;
      pPVar7 = (Part_One_t *)&pPVar7->nOuts;
    }
    else if (iVar2 < iVar3) {
      pPVar8 = (Part_One_t *)&pPVar8->nOuts;
      *(int *)((long)&pPVar4[1].nRefs + uVar6) = iVar2;
    }
    else {
      pPVar7 = (Part_One_t *)&pPVar7->nOuts;
      *(int *)((long)&pPVar4[1].nRefs + uVar6) = iVar3;
    }
    uVar6 = uVar6 + 4;
  }
  for (; pPVar8 < (Part_One_t *)(&p1[1].nRefs + iVar5); pPVar8 = (Part_One_t *)&pPVar8->nOuts) {
    *(int *)((long)&pPVar4[1].nRefs + uVar6) = pPVar8->nRefs;
    uVar6 = uVar6 + 4;
  }
  for (; pPVar7 < (Part_One_t *)(&p2[1].nRefs + iVar1); pPVar7 = (Part_One_t *)&pPVar7->nOuts) {
    *(int *)((long)&pPVar4[1].nRefs + uVar6) = pPVar7->nRefs;
    uVar6 = uVar6 + 4;
  }
  iVar5 = (int)(uVar6 >> 2);
  pPVar4->nOuts = iVar5;
  if (pPVar4->nOutsAlloc < iVar5) {
    __assert_fail("p->nOuts <= p->nOutsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigPart.c"
                  ,0xea,
                  "Part_One_t *Part_ManMergeEntry(Part_Man_t *, Part_One_t *, Part_One_t *, int)");
  }
  if (iVar5 < p1->nOuts) {
    __assert_fail("p->nOuts >= p1->nOuts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigPart.c"
                  ,0xeb,
                  "Part_One_t *Part_ManMergeEntry(Part_Man_t *, Part_One_t *, Part_One_t *, int)");
  }
  if (iVar5 < p2->nOuts) {
    __assert_fail("p->nOuts >= p2->nOuts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigPart.c"
                  ,0xec,
                  "Part_One_t *Part_ManMergeEntry(Part_Man_t *, Part_One_t *, Part_One_t *, int)");
  }
  return pPVar4;
}

Assistant:

Part_One_t * Part_ManMergeEntry( Part_Man_t * pMan, Part_One_t * p1, Part_One_t * p2, int nRefs )
{
    Part_One_t * p = Part_ManFetchEntry( pMan, p1->nOuts + p2->nOuts, nRefs );
    int * pBeg1 = p1->pOuts;
    int * pBeg2 = p2->pOuts;
    int * pBeg  = p->pOuts;
    int * pEnd1 = p1->pOuts + p1->nOuts;
    int * pEnd2 = p2->pOuts + p2->nOuts;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( *pBeg1 < *pBeg2 )
            *pBeg++ = *pBeg1++;
        else 
            *pBeg++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pBeg++ = *pBeg2++;
    p->nOuts = pBeg - p->pOuts;
    assert( p->nOuts <= p->nOutsAlloc );
    assert( p->nOuts >= p1->nOuts );
    assert( p->nOuts >= p2->nOuts );
    return p;
}